

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager.cc
# Opt level: O1

void __thiscall MemoryManager::free(MemoryManager *this,void *__ptr)

{
  MemoryManager *pMVar1;
  long *plVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  
  for (pMVar1 = (MemoryManager *)
                (this->operations).
                super__List_base<const_Operation_*,_std::allocator<const_Operation_*>_>._M_impl.
                _M_node.super__List_node_base._M_next; pMVar1 != this;
      pMVar1 = (MemoryManager *)
               (pMVar1->operations).
               super__List_base<const_Operation_*,_std::allocator<const_Operation_*>_>._M_impl.
               _M_node.super__List_node_base._M_next) {
    plVar2 = (long *)(pMVar1->operations).
                     super__List_base<const_Operation_*,_std::allocator<const_Operation_*>_>._M_impl
                     ._M_node._M_size;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  for (p_Var6 = (this->nodes).super__List_base<const_Node_*,_std::allocator<const_Node_*>_>._M_impl.
                _M_node.super__List_node_base._M_next; p_Var6 != (_List_node_base *)&this->nodes;
      p_Var6 = p_Var6->_M_next) {
    p_Var3 = p_Var6[1]._M_next;
    if (p_Var3 != (_List_node_base *)0x0) {
      p_Var5 = *(_List_node_base **)((long)(p_Var3 + 1) + 8);
      while (p_Var5 != (_List_node_base *)((long)(p_Var3 + 1) + 8U)) {
        p_Var4 = p_Var5->_M_next;
        operator_delete(p_Var5,0x18);
        p_Var5 = p_Var4;
      }
      p_Var5 = p_Var3->_M_next;
      while (p_Var5 != p_Var3) {
        p_Var4 = p_Var5->_M_next;
        operator_delete(p_Var5,0x18);
        p_Var5 = p_Var4;
      }
      operator_delete(p_Var3,0x40);
    }
  }
  std::__cxx11::list<const_Operation_*,_std::allocator<const_Operation_*>_>::clear
            (&this->operations);
  std::__cxx11::list<const_Node_*,_std::allocator<const_Node_*>_>::clear(&this->nodes);
  return;
}

Assistant:

void MemoryManager::free()
{
	for_each(operations.begin(), operations.end(), delete_ptr<Operation>());
	for_each(nodes.begin(), nodes.end(), delete_ptr<Node>());
	operations.clear();
	nodes.clear();
}